

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::InsertEdge
          (GraphCycles *this,GraphId idx,GraphId idy)

{
  int iVar1;
  Rep *r;
  Node **ppNVar2;
  Node *pNVar3;
  int *piVar4;
  int *piVar5;
  NodeSet *pNVar6;
  NodeSet *pNVar7;
  byte bVar8;
  uint uVar9;
  uint64_t uVar10;
  GraphId GVar11;
  bool bVar12;
  uint32_t uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  Node *pNVar24;
  uint uVar25;
  uint uVar26;
  Node *pNVar27;
  uint local_74;
  byte local_6d;
  uint local_6c;
  Vec<int> *local_68;
  Vec<int> *local_60;
  Vec<int> *local_58;
  uint64_t local_50;
  int *local_48;
  NodeSet *local_40;
  NodeSet *local_38;
  ulong uVar28;
  
  r = this->rep_;
  ppNVar2 = (r->nodes_).ptr_;
  pNVar27 = ppNVar2[idx.handle & 0xffffffff];
  if (pNVar27->version != (uint32_t)(idx.handle >> 0x20)) {
    pNVar27 = (Node *)0x0;
  }
  uVar23 = (uint)idy.handle;
  pNVar3 = ppNVar2[idy.handle & 0xffffffff];
  pNVar24 = (Node *)0x0;
  if (pNVar3->version == (uint32_t)(idy.handle >> 0x20)) {
    pNVar24 = pNVar3;
  }
  if (pNVar27 == (Node *)0x0) {
    return true;
  }
  if (pNVar24 == (Node *)0x0) {
    return true;
  }
  if (pNVar27 != pNVar24) {
    local_38 = &pNVar27->out;
    bVar12 = anon_unknown_0::NodeSet::insert(local_38,uVar23);
    if (!bVar12) {
      return true;
    }
    local_40 = &pNVar24->in;
    anon_unknown_0::NodeSet::insert(local_40,(int32_t)idx.handle);
    local_68 = (Vec<int> *)CONCAT44(local_68._4_4_,pNVar27->rank);
    if (pNVar27->rank <= pNVar24->rank) {
      return true;
    }
    piVar4 = (r->deltaf_).ptr_;
    piVar5 = (r->deltaf_).space_;
    local_74 = uVar23;
    if (piVar4 != piVar5) {
      base_internal::LowLevelAlloc::Free(piVar4);
    }
    (r->deltaf_).ptr_ = piVar5;
    (r->deltaf_).size_ = 0;
    (r->deltaf_).capacity_ = 8;
    local_60 = &r->stack_;
    piVar4 = (r->stack_).ptr_;
    piVar5 = (r->stack_).space_;
    if (piVar4 != piVar5) {
      base_internal::LowLevelAlloc::Free(piVar4);
    }
    local_58 = &r->deltaf_;
    (r->stack_).ptr_ = piVar5;
    (r->stack_).size_ = 0;
    (r->stack_).capacity_ = 8;
    local_48 = piVar5;
    anon_unknown_0::Vec<int>::push_back(local_60,(int *)&local_74);
    uVar13 = (r->stack_).size_;
    GVar11.handle = idx.handle;
    bVar8 = local_6d;
    uVar10 = local_50;
    while (local_50 = GVar11.handle, local_6d = uVar13 == 0, bVar15 = local_6d, !(bool)local_6d) {
      local_74 = (r->stack_).ptr_[uVar13 - 1];
      (r->stack_).size_ = uVar13 - 1;
      pNVar27 = (r->nodes_).ptr_[local_74];
      if (pNVar27->visited == false) {
        pNVar27->visited = true;
        anon_unknown_0::Vec<int>::push_back(local_58,(int *)&local_74);
        uVar22 = 0;
        uVar25 = local_6c;
LAB_0035b4c7:
        uVar18 = (pNVar27->out).table_.size_;
        uVar16 = uVar18;
        if (uVar18 < uVar22) {
          uVar16 = uVar22;
        }
        do {
          uVar21 = uVar22;
          uVar26 = uVar25;
          uVar22 = uVar16;
          uVar17 = uVar16;
          uVar9 = local_6c;
          if (uVar16 == uVar21) break;
          uVar26 = (pNVar27->out).table_.ptr_[uVar21];
          uVar22 = uVar21 + 1;
          uVar17 = uVar21;
          uVar9 = uVar26;
        } while ((int)uVar26 < 0);
        local_6c = uVar9;
        uVar25 = uVar26;
        idx.handle = local_50;
        if (uVar17 < uVar18) {
          pNVar3 = (r->nodes_).ptr_[uVar25];
          iVar1 = pNVar3->rank;
          bVar15 = local_6d;
          bVar8 = local_6d;
          uVar10 = local_50;
          if (iVar1 == (int)local_68) break;
          if ((iVar1 < (int)local_68) && (pNVar3->visited == false)) {
            anon_unknown_0::Vec<int>::push_back(local_60,(int *)&local_6c);
          }
          goto LAB_0035b4c7;
        }
      }
      GVar11.handle = local_50;
      bVar8 = local_6d;
      uVar10 = local_50;
      uVar13 = (r->stack_).size_;
    }
    local_50 = uVar10;
    local_6d = bVar8;
    pNVar7 = local_38;
    uVar25 = (uint)idx.handle;
    if ((bVar15 & 1) != 0) {
      iVar1 = pNVar24->rank;
      piVar4 = (r->deltab_).ptr_;
      piVar5 = (r->deltab_).space_;
      local_74 = uVar25;
      if (piVar4 != piVar5) {
        base_internal::LowLevelAlloc::Free(piVar4);
      }
      (r->deltab_).ptr_ = piVar5;
      (r->deltab_).size_ = 0;
      (r->deltab_).capacity_ = 8;
      piVar5 = (r->stack_).ptr_;
      if (piVar5 != local_48) {
        base_internal::LowLevelAlloc::Free(piVar5);
      }
      local_68 = &r->deltab_;
      (r->stack_).ptr_ = local_48;
      (r->stack_).size_ = 0;
      (r->stack_).capacity_ = 8;
      anon_unknown_0::Vec<int>::push_back(local_60,(int *)&local_74);
      uVar13 = (r->stack_).size_;
      if (uVar13 != 0) {
        do {
          local_74 = (r->stack_).ptr_[uVar13 - 1];
          (r->stack_).size_ = uVar13 - 1;
          pNVar27 = (r->nodes_).ptr_[local_74];
          if (pNVar27->visited == false) {
            pNVar27->visited = true;
            anon_unknown_0::Vec<int>::push_back(local_68,(int *)&local_74);
            uVar14 = 0;
            uVar23 = local_6c;
LAB_0035b63a:
            uVar25 = (pNVar27->in).table_.size_;
            uVar20 = (ulong)uVar25;
            uVar28 = uVar14;
            if (uVar25 < (uint)uVar14) {
              uVar20 = uVar14;
            }
            do {
              uVar26 = (uint)uVar28;
              uVar14 = uVar20;
              uVar22 = uVar23;
              uVar18 = (uint)uVar20;
              uVar16 = local_6c;
              if ((uint)uVar20 == uVar26) break;
              uVar22 = (pNVar27->in).table_.ptr_[uVar28];
              uVar14 = (ulong)(uVar26 + 1);
              uVar28 = uVar14;
              uVar18 = uVar26;
              uVar16 = uVar22;
            } while ((int)uVar22 < 0);
            local_6c = uVar16;
            uVar23 = uVar22;
            if (uVar18 < uVar25) {
              pNVar3 = (r->nodes_).ptr_[uVar23];
              if ((pNVar3->visited == false) && (iVar1 < pNVar3->rank)) {
                anon_unknown_0::Vec<int>::push_back(local_60,(int *)&local_6c);
              }
              goto LAB_0035b63a;
            }
          }
          uVar13 = (r->stack_).size_;
        } while (uVar13 != 0);
      }
      Sort(&r->nodes_,local_68);
      Sort(&r->nodes_,local_58);
      piVar4 = (r->list_).ptr_;
      piVar5 = (r->list_).space_;
      if (piVar4 != piVar5) {
        base_internal::LowLevelAlloc::Free(piVar4);
      }
      (r->list_).ptr_ = piVar5;
      (r->list_).size_ = 0;
      (r->list_).capacity_ = 8;
      MoveToList(r,local_68,&r->list_);
      MoveToList(r,local_58,&r->list_);
      uVar23 = (r->deltaf_).size_ + (r->deltab_).size_;
      if ((r->merged_).capacity_ < uVar23) {
        anon_unknown_0::Vec<int>::Grow(&r->merged_,uVar23);
      }
      (r->merged_).size_ = uVar23;
      piVar5 = (r->deltab_).ptr_;
      piVar4 = (r->deltaf_).ptr_;
      std::__merge<int*,int*,int*,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar5,piVar5 + (r->deltab_).size_,piVar4,piVar4 + (r->deltaf_).size_,
                 (r->merged_).ptr_);
      uVar14 = (ulong)(r->list_).size_;
      if (uVar14 == 0) {
        return true;
      }
      piVar5 = (r->merged_).ptr_;
      piVar4 = (r->list_).ptr_;
      ppNVar2 = (r->nodes_).ptr_;
      uVar20 = 0;
      do {
        ppNVar2[(uint)piVar4[uVar20]]->rank = piVar5[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar14 != uVar20);
      return true;
    }
    uVar13 = anon_unknown_0::NodeSet::FindIndex(local_38,uVar23);
    pNVar6 = local_40;
    piVar5 = (pNVar7->table_).ptr_;
    if (piVar5[uVar13] == uVar23) {
      piVar5[uVar13] = -2;
    }
    uVar13 = anon_unknown_0::NodeSet::FindIndex(local_40,uVar25);
    piVar5 = (pNVar6->table_).ptr_;
    if (piVar5[uVar13] == uVar25) {
      piVar5[uVar13] = -2;
    }
    uVar14 = (ulong)(r->deltaf_).size_;
    if (uVar14 != 0) {
      piVar5 = (r->deltaf_).ptr_;
      ppNVar2 = (r->nodes_).ptr_;
      lVar19 = 0;
      do {
        ppNVar2[*(uint *)((long)piVar5 + lVar19)]->visited = false;
        lVar19 = lVar19 + 4;
      } while (uVar14 << 2 != lVar19);
      return false;
    }
  }
  return false;
}

Assistant:

bool GraphCycles::InsertEdge(GraphId idx, GraphId idy) {
  Rep* r = rep_;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);
  Node* nx = FindNode(r, idx);
  Node* ny = FindNode(r, idy);
  if (nx == nullptr || ny == nullptr) return true;  // Expired ids

  if (nx == ny) return false;  // Self edge
  if (!nx->out.insert(y)) {
    // Edge already exists.
    return true;
  }

  ny->in.insert(x);

  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx->out.erase(y);
    ny->in.erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    for (const auto& d : r->deltaf_) {
      r->nodes_[static_cast<uint32_t>(d)]->visited = false;
    }
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}